

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

bool __thiscall QJsonPrivate::Parser::parseArray(Parser *this)

{
  byte *pbVar1;
  QCborContainerPrivate *ptr;
  byte *pbVar2;
  int iVar3;
  byte bVar4;
  byte *pbVar5;
  bool bVar6;
  
  iVar3 = this->nestingLevel;
  this->nestingLevel = iVar3 + 1;
  if (iVar3 < 0x400) {
    pbVar2 = (byte *)this->json;
    pbVar1 = (byte *)this->end;
    if (pbVar1 <= pbVar2) goto LAB_00151075;
    bVar4 = *pbVar2;
    if ((char)bVar4 < '!') {
      bVar6 = true;
      while ((pbVar5 = pbVar2 + 1, bVar4 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar5;
        bVar6 = pbVar5 < pbVar1;
        pbVar2 = pbVar5;
        if ((pbVar5 == pbVar1) || (bVar4 = *pbVar5, ' ' < (char)bVar4)) break;
      }
      if (!bVar6) goto LAB_00151075;
      bVar4 = *pbVar2;
    }
    if (bVar4 == 0x5d) {
      if (pbVar2 < pbVar1) {
        this->json = (char *)(pbVar2 + 1);
      }
    }
    else {
      do {
        if (pbVar1 <= pbVar2) goto LAB_00151075;
        bVar4 = *pbVar2;
        if ((char)bVar4 < '!') {
          bVar6 = true;
          while ((pbVar2 = pbVar2 + 1, bVar4 < 0x21 &&
                 ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
            this->json = (char *)pbVar2;
            bVar6 = pbVar2 < pbVar1;
            if ((pbVar2 == pbVar1) || (bVar4 = *pbVar2, ' ' < (char)bVar4)) break;
          }
          if (!bVar6) goto LAB_00151075;
        }
        if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
          ptr = (QCborContainerPrivate *)operator_new(0x40);
          (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i = 0;
          ptr->usedData = 0;
          (ptr->data).d.d = (Data *)0x0;
          (ptr->data).d.ptr = (char *)0x0;
          (ptr->data).d.size = 0;
          (ptr->elements).d.d = (Data *)0x0;
          (ptr->elements).d.ptr = (Element *)0x0;
          (ptr->elements).d.size = 0;
          QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,ptr);
        }
        bVar6 = parseValueIntoContainer(this);
        if (!bVar6) goto LAB_0015107c;
        pbVar2 = (byte *)this->json;
        pbVar1 = (byte *)this->end;
        if (pbVar1 <= pbVar2) goto LAB_0015102c;
        bVar4 = *pbVar2;
        pbVar5 = pbVar2;
        if ((char)bVar4 < '!') {
          bVar6 = true;
          while ((pbVar5 = pbVar2 + 1, bVar4 < 0x21 &&
                 ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
            this->json = (char *)pbVar5;
            bVar6 = pbVar5 < pbVar1;
            pbVar2 = pbVar5;
            if ((pbVar5 == pbVar1) || (bVar4 = *pbVar5, ' ' < (char)bVar4)) break;
          }
          pbVar5 = pbVar2;
          if (!bVar6) goto LAB_0015102c;
        }
        pbVar2 = pbVar5 + 1;
        this->json = (char *)pbVar2;
      } while (*pbVar5 == 0x2c);
      if (*pbVar5 != 0x5d) {
LAB_0015102c:
        if (pbVar2 < pbVar1) {
          bVar4 = *pbVar2;
          if ((char)bVar4 < '!') {
            bVar6 = true;
            while ((pbVar2 = pbVar2 + 1, bVar4 < 0x21 &&
                   ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
              this->json = (char *)pbVar2;
              bVar6 = pbVar2 < pbVar1;
              if ((pbVar2 == pbVar1) || (bVar4 = *pbVar2, ' ' < (char)bVar4)) break;
            }
            if (!bVar6) goto LAB_00151075;
          }
          this->lastError = MissingValueSeparator;
        }
        else {
LAB_00151075:
          this->lastError = UnterminatedArray;
        }
        goto LAB_0015107c;
      }
      iVar3 = this->nestingLevel + -1;
    }
    this->nestingLevel = iVar3;
    bVar6 = true;
  }
  else {
    this->lastError = DeepNesting;
LAB_0015107c:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Parser::parseArray()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedArray;
        return false;
    }
    if (*json == EndArray) {
        nextToken();
    } else {
        while (1) {
            if (!eatSpace()) {
                lastError = QJsonParseError::UnterminatedArray;
                return false;
            }
            if (!container)
                container = new QCborContainerPrivate;

            if (!parseValueIntoContainer())
                return false;

            char token = nextToken();
            if (token == EndArray)
                break;
            else if (token != ValueSeparator) {
                if (!eatSpace())
                    lastError = QJsonParseError::UnterminatedArray;
                else
                    lastError = QJsonParseError::MissingValueSeparator;
                return false;
            }
        }
    }

    --nestingLevel;

    return true;
}